

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valfmt_set.c
# Opt level: O1

int mpt_valfmt_set(mpt_array *arr,mpt_convertable *src)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  mpt_value_format fmt;
  mpt_array tmp;
  mpt_iterator *it;
  char *from;
  mpt_value_format local_3c;
  mpt_array local_38;
  long *local_30;
  char *local_28;
  
  local_38._buf = (mpt_buffer *)0x0;
  if (src == (mpt_convertable *)0x0) {
    return (uint)(arr->_buf == (mpt_buffer *)0x0) * 4 + -4;
  }
  local_30 = (long *)0x0;
  iVar4 = (*src->_vptr->convert)(src,0x86,&local_30);
  if ((iVar4 < 1) || (local_30 == (long *)0x0)) {
    iVar4 = (*src->_vptr->convert)(src,0x18,&local_3c);
    if (iVar4 < 0) {
      local_28 = (char *)0x0;
      iVar4 = (*src->_vptr->convert)(src,0x73,&local_28);
      if ((iVar4 < 0) || ((iVar4 != 0 && (iVar4 = mpt_valfmt_parse(&local_38,local_28), iVar4 < 0)))
         ) {
        bVar2 = false;
      }
      else {
        iVar4 = 0;
        bVar2 = true;
      }
      if (!bVar2) {
        return iVar4;
      }
    }
    else {
      iVar5 = mpt_valfmt_add(&local_38,local_3c);
      iVar4 = 0;
      if (iVar5 < 0) {
        mpt_array_clone(&local_38,(mpt_array *)0x0);
        return iVar5;
      }
    }
  }
  else {
    iVar4 = 0;
    do {
      puVar6 = (undefined8 *)(**(code **)*local_30)();
      if (puVar6 == (undefined8 *)0x0) {
        cVar3 = '\x03';
      }
      else {
        local_3c.flags = 0;
        local_3c.width = '\0';
        local_3c.dec = '\0';
        lVar1 = puVar6[1];
        if (((lVar1 == 0x80) || (lVar1 == 0x801)) || (lVar1 - 0x100U < 0x700)) {
          puVar6 = *(undefined8 **)*puVar6;
          if (puVar6 != (undefined8 *)0x0) {
            (**(code **)*puVar6)(puVar6,0x18,&local_3c);
          }
        }
        else if ((lVar1 == 0x18) && ((mpt_value_format *)*puVar6 != (mpt_value_format *)0x0)) {
          local_3c = *(mpt_value_format *)*puVar6;
        }
        iVar5 = mpt_valfmt_add(&local_38,local_3c);
        if (iVar5 < 0) {
          cVar3 = '\x01';
        }
        else {
          iVar5 = (**(code **)(*local_30 + 8))();
          cVar3 = (iVar5 < 1) * '\x03';
          iVar4 = iVar4 + (uint)(0 < iVar5);
        }
      }
    } while (cVar3 == '\0');
    if (cVar3 != '\x03') {
      return 1;
    }
  }
  mpt_array_clone(arr,&local_38);
  mpt_array_clone(&local_38,(mpt_array *)0x0);
  return iVar4;
}

Assistant:

extern int mpt_valfmt_set(MPT_STRUCT(array) *arr, MPT_INTERFACE(convertable) *src)
{
	MPT_INTERFACE(iterator) *it;
	MPT_STRUCT(array) tmp = MPT_ARRAY_INIT;
	MPT_STRUCT(value_format) fmt;
	int ret, curr;
	
	if (!src) {
		static const MPT_STRUCT(type_traits) *traits = 0;
		MPT_STRUCT(buffer) *buf;
		if (!(buf = arr->_buf)) {
			return 0;
		}
		/* initialize traits binding */
		if (!traits || (!(traits = mpt_type_traits(MPT_ENUM(TypeValFmt))))) {
			return MPT_ERROR(BadOperation);
		}
		if (!buf) {
			if (!(buf = _mpt_buffer_alloc(0, 0))) {
				return MPT_ERROR(BadOperation);
			}
			buf->_content_traits = traits;
		}
		else if (traits != buf->_content_traits) {
			return MPT_ERROR(BadType);
		}
		else {
			if ((buf = buf->_vptr->detach(buf, 0))) {
				return MPT_ERROR(BadOperation);
			}
			buf->_used = 0;
		}
		return MPT_ENUM(TypeValFmt);
	}
	/* get elements from iterator */
	it = 0;
	if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeIteratorPtr), &it)) > 0
	    && it) {
		ret = 0;
		while (1) {
			static const MPT_STRUCT(value_format) def = MPT_VALFMT_INIT;
			const MPT_STRUCT(value) *val;
			
			if (!(val = it->_vptr->value(it))) {
				break;
			}
			fmt = def;
			if (MPT_type_isConvertable(val->_type)) {
				MPT_INTERFACE(convertable) *elem;
				if ((elem = *((void * const *) val->_addr))) {
					elem->_vptr->convert(elem, MPT_ENUM(TypeValFmt), &fmt);
				}
			}
			else if (val->_type == MPT_ENUM(TypeValFmt) && val->_addr) {
				fmt = *((const MPT_STRUCT(value_format) *) val->_addr);
			}
			if ((curr = mpt_valfmt_add(&tmp, fmt) < 0)) {
				return curr;
			}
			if ((curr = it->_vptr->advance(it) <= 0)) {
				break;
			}
			++ret;
		}
	}
	/* assign single element */
	else if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeValFmt), &fmt)) >= 0) {
		if ((curr = mpt_valfmt_add(&tmp, fmt)) < 0) {
			mpt_array_clone(&tmp, 0);
			return curr;
		}
		ret = 0;
	}
	/* get elements from string value */
	else {
		const char *from = 0;
		if ((ret = src->_vptr->convert(src, 's', &from)) < 0) {
			return ret;
		}
		if (ret && (ret = mpt_valfmt_parse(&tmp, from)) < 0) {
			return ret;
		}
		ret = 0;
	}
	mpt_array_clone(arr, &tmp);
	mpt_array_clone(&tmp, 0);
	return ret;
}